

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O1

void __thiscall soplex::SPxSteepPR<double>::left4(SPxSteepPR<double> *this,int n,SPxId id)

{
  double dVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  UpdateVector<double> *pUVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (id.super_DataKey.info != 0) {
    pSVar3 = (this->super_SPxPricer<double>).thesolver;
    pdVar4 = (this->workVec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar2 = (pSVar3->super_SPxBasisBase<double>).iterCount;
    pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pSVar3->theFvec->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    dVar10 = 1.0 / pdVar6[n];
    dVar11 = SSVectorBase<double>::length2(&pSVar3->theCoPvec->thedelta);
    dVar11 = dVar11 * dVar10 * dVar10;
    pUVar7 = ((this->super_SPxPricer<double>).thesolver)->theFvec;
    lVar9 = (long)(pUVar7->thedelta).super_IdxSet.num;
    if (0 < lVar9) {
      dVar13 = 1.0 / (double)iVar2 + 0.1;
      dVar1 = *(double *)(in_FS_OFFSET + -8);
      lVar8 = 0;
      do {
        iVar2 = (pUVar7->thedelta).super_IdxSet.idx[lVar8];
        dVar12 = pdVar6[iVar2];
        dVar14 = (dVar11 * dVar12 - pdVar4[iVar2] * (dVar10 + dVar10)) * dVar12 + pdVar5[iVar2];
        pdVar5[iVar2] = dVar14;
        dVar12 = dVar13;
        if (dVar14 < dVar13) {
LAB_0020da6e:
          pdVar5[iVar2] = dVar12;
        }
        else {
          ::soplex::infinity::__tls_init();
          if (dVar1 <= dVar14) {
            dVar12 = 1.0 / (this->super_SPxPricer<double>).thetolerance;
            goto LAB_0020da6e;
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    pdVar5[n] = dVar11;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }